

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManCreateMultiRefs(Dam_Man_t *p,Vec_Int_t **pvRefsAnd,Vec_Int_t **pvRefsXor)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  int *piVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  Vec_Int_t *pVVar8;
  int *__s_00;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  pGVar2 = p->pGia;
  uVar1 = pGVar2->nObjs;
  uVar6 = uVar1 * 2;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar11 = uVar6;
  }
  pVVar7->nCap = uVar11;
  if (uVar11 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar6;
LAB_007045c7:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar11 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = uVar6;
    if (__s == (int *)0x0) goto LAB_007045c7;
    memset(__s,0,(long)(int)uVar1 << 3);
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar11 = uVar1;
  }
  pVVar8->nCap = uVar11;
  if (uVar11 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = uVar1;
  }
  else {
    __s_00 = (int *)malloc((long)(int)uVar11 << 2);
    pVVar8->pArray = __s_00;
    pVVar8->nSize = uVar1;
    if (__s_00 != (int *)0x0) {
      memset(__s_00,0,(long)(int)uVar1 << 2);
      goto LAB_0070463c;
    }
  }
  __s_00 = (int *)0x0;
LAB_0070463c:
  if ((0 < (int)uVar1) && (pGVar3 = pGVar2->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(pGVar3 + uVar9);
      uVar11 = (uint)uVar4;
      if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
         ((long)uVar9 < (long)p->vNod2Set->nSize)) {
        uVar12 = p->vNod2Set->pArray[uVar9];
        uVar10 = (ulong)uVar12;
        if (uVar10 != 0) {
          if (((int)uVar12 < 0) || (p->vSetStore->nSize <= (int)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar5 = p->vSetStore->pArray;
          uVar12 = (uint)((ulong)uVar4 >> 0x20) & 0x1fffffff;
          if ((uVar11 & 0x1fffffff) < uVar12) {
            if (0 < piVar5[uVar10]) {
              lVar13 = 0;
              do {
                uVar11 = piVar5[uVar10 + lVar13 + 1];
                if ((int)uVar11 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x130,"int Abc_LitIsCompl(int)");
                }
                if ((uVar11 & 1) != 0) {
                  __assert_fail("!Abc_LitIsCompl(pSet[k])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                                ,0x254,
                                "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)"
                               );
                }
                if ((int)uVar1 <= (int)(uVar11 >> 1)) {
LAB_00704795:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                __s_00[uVar11 >> 1] = __s_00[uVar11 >> 1] + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < piVar5[uVar10]);
            }
          }
          else {
            if (((uVar11 & 0x1fffffff) <= uVar12) ||
               ((pGVar2->pMuxes != (uint *)0x0 && (pGVar2->pMuxes[uVar9] != 0)))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                            ,0x25a,
                            "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
            }
            if (0 < piVar5[uVar10]) {
              lVar13 = 0;
              do {
                if (uVar6 <= (uint)piVar5[uVar10 + lVar13 + 1]) goto LAB_00704795;
                __s[(uint)piVar5[uVar10 + lVar13 + 1]] = __s[(uint)piVar5[uVar10 + lVar13 + 1]] + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < piVar5[uVar10]);
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar1);
  }
  *pvRefsAnd = pVVar7;
  *pvRefsXor = pVVar8;
  return;
}

Assistant:

void Dam_ManCreateMultiRefs( Dam_Man_t * p, Vec_Int_t ** pvRefsAnd, Vec_Int_t ** pvRefsXor )  
{
    Vec_Int_t * vRefsAnd, * vRefsXor;
    Gia_Obj_t * pObj;
    int i, k, * pSet;
    vRefsAnd = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) );
    vRefsXor = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        if ( Gia_ObjIsXor(pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
            {
                assert( !Abc_LitIsCompl(pSet[k]) );
                Vec_IntAddToEntry( vRefsXor, Abc_Lit2Var(pSet[k]), 1 );
            }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
                Vec_IntAddToEntry( vRefsAnd, pSet[k], 1 );
        else assert( 0 );
    }
    *pvRefsAnd = vRefsAnd;
    *pvRefsXor = vRefsXor;
}